

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_pack4_sse
               (Mat *kernel,Mat *kernel_tm_pack4,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  undefined8 uVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  undefined4 *puVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  undefined8 *puVar22;
  void *pvVar23;
  long lVar24;
  void *pvVar25;
  ulong uVar26;
  undefined4 *puVar27;
  undefined4 *puVar28;
  int i;
  long lVar29;
  undefined4 *puVar30;
  ulong uVar31;
  void *pvVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float tmp [6] [3];
  Mat local_c8;
  undefined8 uStack_80;
  float fStack_78;
  undefined8 auStack_74 [8];
  
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,0x24,inch,outch,4,(Allocator *)0x0);
  if (0 < outch) {
    pvVar7 = kernel->data;
    uVar26 = 0;
    pvVar32 = local_c8.data;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)uVar26;
        uVar31 = 0;
        pvVar25 = pvVar32;
        do {
          fVar1 = *(float *)((long)pvVar7 + uVar31 * 0x24 + (long)iVar18 * 4 + 0x18);
          fVar2 = *(float *)((long)pvVar7 + uVar31 * 0x24 + (long)iVar18 * 4 + 0x1c);
          fVar3 = *(float *)((long)pvVar7 + uVar31 * 0x24 + (long)iVar18 * 4 + 0x20);
          auVar10 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 + uVar31 * 0x24 + (long)iVar18 * 4)
                                         ),ZEXT416(*(uint *)((long)pvVar7 +
                                                            uVar31 * 0x24 + (long)iVar18 * 4 + 0x10)
                                                  ),0x10);
          auVar34 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 +
                                                   uVar31 * 0x24 + (long)iVar18 * 4 + 0xc)),
                                  ZEXT416(*(uint *)((long)pvVar7 +
                                                   uVar31 * 0x24 + (long)iVar18 * 4 + 4)),0x10);
          auVar11 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 +
                                                   uVar31 * 0x24 + (long)iVar18 * 4 + 8)),
                                  ZEXT416(*(uint *)((long)pvVar7 +
                                                   uVar31 * 0x24 + (long)iVar18 * 4 + 0x14)),0x10);
          lVar20 = 8;
          do {
            uVar5 = *(ulong *)((long)&DAT_005197d8 + lVar20);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar5;
            fVar12 = (float)uVar5;
            auVar36._0_4_ = auVar34._0_4_ * fVar12;
            fVar13 = (float)(uVar5 >> 0x20);
            auVar36._4_4_ = auVar34._4_4_ * fVar13;
            auVar36._8_4_ = auVar34._8_4_ * 0.0;
            auVar36._12_4_ = auVar34._12_4_ * 0.0;
            auVar36 = vshufps_avx(auVar36,auVar36,0xe1);
            fVar4 = *(float *)((long)&DAT_005197e0 + lVar20);
            auVar37._0_4_ = auVar10._0_4_ * fVar12 + fVar4 * auVar11._0_4_ + auVar36._0_4_;
            auVar37._4_4_ = auVar10._4_4_ * fVar13 + fVar4 * auVar11._4_4_ + auVar36._4_4_;
            auVar37._8_4_ = auVar10._8_4_ * 0.0 + fVar4 * auVar11._8_4_ + auVar36._8_4_;
            auVar37._12_4_ = auVar10._12_4_ * 0.0 + fVar4 * auVar11._12_4_ + auVar36._12_4_;
            uVar6 = vmovlps_avx(auVar37);
            *(undefined8 *)((long)&uStack_80 + lVar20) = uVar6;
            auVar36 = vmovshdup_avx(auVar35);
            *(float *)((long)auStack_74 + lVar20 + -4) =
                 fVar2 * auVar36._0_4_ + fVar4 * fVar3 + fVar1 * fVar12;
            lVar20 = lVar20 + 0xc;
          } while (lVar20 != 0x50);
          lVar20 = 0;
          pvVar23 = pvVar25;
          do {
            fVar1 = *(float *)((long)auStack_74 + lVar20 * 0xc + -4);
            uVar6 = *(undefined8 *)((long)auStack_74 + lVar20 * 0xc);
            puVar22 = (undefined8 *)((long)&DAT_005197e0 + 4);
            lVar29 = 0;
            do {
              auVar34._0_4_ = (float)*puVar22 * (float)uVar6;
              auVar34._4_4_ = (float)((ulong)*puVar22 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
              auVar34._8_8_ = 0;
              auVar10 = vmovshdup_avx(auVar34);
              *(float *)((long)pvVar23 + lVar29 * 4) =
                   auVar34._0_4_ + fVar1 * *(float *)((long)puVar22 + -4) + auVar10._0_4_;
              lVar29 = lVar29 + 1;
              puVar22 = (undefined8 *)((long)puVar22 + 0xc);
            } while (lVar29 != 6);
            lVar20 = lVar20 + 1;
            pvVar23 = (void *)((long)pvVar23 + 0x18);
          } while (lVar20 != 6);
          uVar31 = uVar31 + 1;
          pvVar25 = (void *)((long)pvVar25 +
                            (long)local_c8.w *
                            CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
        } while (uVar31 != (uint)inch);
      }
      uVar26 = uVar26 + 1;
      pvVar32 = (void *)((long)pvVar32 +
                        local_c8.cstep *
                        CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
    } while (uVar26 != (uint)outch);
  }
  iVar18 = inch + 3;
  if (-1 < inch) {
    iVar18 = inch;
  }
  iVar19 = outch + 3;
  if (-1 < outch) {
    iVar19 = outch;
  }
  Mat::create(kernel_tm_pack4,iVar18 >> 2,0x24,iVar19 >> 2,0x40,0x10,(Allocator *)0x0);
  if (3 < outch) {
    iVar18 = kernel_tm_pack4->w;
    pvVar7 = kernel_tm_pack4->data;
    sVar8 = kernel_tm_pack4->elemsize;
    sVar9 = kernel_tm_pack4->cstep;
    uVar26 = 0;
    do {
      lVar29 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      lVar20 = (long)local_c8.w * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      puVar30 = (undefined4 *)(lVar29 * uVar26 + (long)local_c8.data);
      lVar33 = 0;
      do {
        if (3 < inch) {
          lVar15 = (long)pvVar7 + (long)iVar18 * sVar8 * lVar33 + (uVar26 >> 2) * sVar9 * sVar8;
          lVar24 = 0;
          puVar27 = puVar30;
          do {
            lVar21 = 0;
            puVar28 = puVar27;
            do {
              lVar16 = lVar15;
              lVar15 = 0;
              puVar17 = puVar28;
              do {
                *(undefined4 *)(lVar16 + lVar15) = *puVar17;
                puVar17 = (undefined4 *)((long)puVar17 + lVar29);
                lVar15 = lVar15 + 4;
              } while (lVar15 != 0x10);
              lVar21 = lVar21 + 1;
              puVar28 = (undefined4 *)((long)puVar28 + lVar20);
              lVar15 = lVar16 + 0x10;
            } while (lVar21 != 4);
            lVar21 = lVar24 + 7;
            puVar27 = puVar27 + lVar20;
            lVar15 = lVar16 + 0x10;
            lVar24 = lVar24 + 4;
          } while (lVar21 < inch);
        }
        lVar33 = lVar33 + 1;
        puVar30 = puVar30 + 1;
      } while (lVar33 != 0x24);
      uVar31 = uVar26 + 7;
      uVar26 = uVar26 + 4;
    } while (uVar31 < (uint)outch);
  }
  piVar14 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack4_sse(const Mat& kernel, Mat& kernel_tm_pack4, int inch, int outch, const Option& opt)
{
    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch);

    const float ktm[6][3] = {
        {1.0f / 4, 0.0f, 0.0f},
        {-1.0f / 6, -1.0f / 6, -1.0f / 6},
        {-1.0f / 6, 1.0f / 6, -1.0f / 6},
        {1.0f / 24, 1.0f / 12, 1.0f / 6},
        {1.0f / 24, -1.0f / 12, 1.0f / 6},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = pb-pa-inch/pa-36-outch/pb
    kernel_tm_pack4.create(inch / 4, 36, outch / 4, (size_t)4u * 4 * 4, 4 * 4);

    for (int q = 0; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm_pack4.channel(q / 4);

        for (int k = 0; k < 36; k++)
        {
            float* g00 = g0.row<float>(k);

            for (int p = 0; p + 3 < inch; p += 4)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}